

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O3

int ffpcom(fitsfile *fptr,char *comm,int *status)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  char card [81];
  char local_88 [88];
  
  iVar2 = *status;
  if (iVar2 < 1) {
    sVar1 = strlen(comm);
    if (0 < (int)sVar1) {
      uVar3 = (int)sVar1 + 0x48;
      do {
        builtin_strncpy(local_88,"COMMENT ",9);
        strncat(local_88,comm,0x48);
        ffprec(fptr,local_88,status);
        comm = comm + 0x48;
        uVar3 = uVar3 - 0x48;
      } while (0x48 < uVar3);
      iVar2 = *status;
    }
  }
  return iVar2;
}

Assistant:

int ffpcom( fitsfile *fptr,      /* I - FITS file pointer   */
            const char  *comm,   /* I - comment string      */
            int   *status)       /* IO - error status       */
/*
  Write 1 or more COMMENT keywords.  If the comment string is too
  long to fit on a single keyword (72 chars) then it will automatically
  be continued on multiple CONTINUE keywords.
*/
{
    char card[FLEN_CARD];
    int len, ii;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    len = strlen(comm);
    ii = 0;

    for (; len > 0; len -= 72)
    {
        strcpy(card, "COMMENT ");
        strncat(card, &comm[ii], 72);
        ffprec(fptr, card, status);
        ii += 72;
    }

    return(*status);
}